

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall
iutest::detail::FieldMatcher<int_test::syntax_tests::X::*,int>::Check<test::syntax_tests::X*>
          (FieldMatcher<int_test::syntax_tests::X::*,int> *this,X **actual,type **param_2)

{
  EqMatcher<int> local_48;
  AssertionResult local_38;
  
  local_48.m_expected = (int *)(this + 0x10);
  local_48.super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_0039f6f8;
  EqMatcher<int>::operator()
            (&local_38,&local_48,(int *)((long)&(*actual)->a + **(long **)(this + 8)));
  std::__cxx11::string::~string((string *)&local_38);
  return local_38.m_result;
}

Assistant:

bool Check(const U& actual
        , typename detail::enable_if_t< detail::is_pointer<U> >::type*& = detail::enabler::value)
    {
        return static_cast<bool>(CastToMatcher(m_expected)(actual->*m_field));
    }